

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_transform_kernel_int8_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  Mat *in_RDI;
  int i_1;
  short *tmpp;
  int j;
  int i;
  short tmp [6] [3];
  char *k2;
  char *k1;
  char *k0;
  short *kernel_tm0;
  char *kernel0;
  int q;
  int p;
  short ktm [6] [3];
  Allocator *in_stack_fffffffffffffee0;
  Mat *this;
  Mat *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int iVar2;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar3;
  short local_f8 [24];
  char *local_c8;
  char *local_c0;
  char *local_b8;
  Mat local_a0;
  Mat *local_60;
  char *local_58;
  int local_50;
  int local_4c;
  short local_48 [24];
  int local_18;
  int local_14;
  Mat *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8,
              in_stack_fffffffffffffef4,(size_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0)
  ;
  memcpy(local_48,&DAT_001b5d10,0x24);
  for (local_4c = 0; local_4c < local_18; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < local_14; local_50 = local_50 + 1) {
      local_58 = Mat::operator_cast_to_signed_char_(local_8);
      local_58 = local_58 + (long)(local_50 * 9) + (long)(local_4c * local_14 * 9);
      this = &local_a0;
      Mat::channel(in_stack_fffffffffffffee8,(int)((ulong)this >> 0x20));
      in_stack_fffffffffffffee8 = (Mat *)Mat::row<short>(this,local_50);
      Mat::~Mat((Mat *)0x12c250);
      local_b8 = local_58;
      local_c0 = local_58 + 3;
      local_c8 = local_58 + 6;
      for (iVar3 = 0; iVar3 < 6; iVar3 = iVar3 + 1) {
        local_f8[(long)iVar3 * 3] =
             (short)*local_58 * local_48[(long)iVar3 * 3] +
             (short)local_58[1] * local_48[(long)iVar3 * 3 + 1] +
             (short)local_58[2] * local_48[(long)iVar3 * 3 + 2];
        local_f8[(long)iVar3 * 3 + 1] =
             (short)*local_c0 * local_48[(long)iVar3 * 3] +
             (short)local_58[4] * local_48[(long)iVar3 * 3 + 1] +
             (short)local_58[5] * local_48[(long)iVar3 * 3 + 2];
        local_f8[(long)iVar3 * 3 + 2] =
             (short)*local_c8 * local_48[(long)iVar3 * 3] +
             (short)local_58[7] * local_48[(long)iVar3 * 3 + 1] +
             (short)local_58[8] * local_48[(long)iVar3 * 3 + 2];
      }
      for (iVar3 = 0; iVar3 < 6; iVar3 = iVar3 + 1) {
        lVar1 = (long)iVar3;
        for (iVar2 = 0; iVar2 < 6; iVar2 = iVar2 + 1) {
          *(short *)((long)&in_stack_fffffffffffffee8->data + (long)(iVar3 * 6 + iVar2) * 2) =
               local_f8[lVar1 * 3] * local_48[(long)iVar2 * 3] +
               local_f8[lVar1 * 3 + 1] * local_48[(long)iVar2 * 3 + 1] +
               local_f8[lVar1 * 3 + 2] * local_48[(long)iVar2 * 3 + 2];
        }
      }
      local_60 = in_stack_fffffffffffffee8;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_int8_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch)
{
    kernel_tm.create(6*6, inch, outch, 2ul);

    // G
    // const float ktm[6][3] = {
    //     {  1.0f/4,     0.0f,    0.0f},
    //     { -1.0f/6,  -1.0f/6, -1.0f/6},
    //     { -1.0f/6,   1.0f/6, -1.0f/6},
    //     { 1.0f/24,  1.0f/12,  1.0f/6},
    //     { 1.0f/24, -1.0f/12,  1.0f/6},
    //     {    0.0f,     0.0f,    1.0f}
    // };
    const short ktm[6][3] = {
        {  6,    0,    0},
        { -4,   -4,   -4},
        { -4,    4,   -4},
        {  1,    2,    4},
        {  1,   -2,    4},
        {  0,    0,   24}
    };    

    #pragma omp parallel for
    for (int p = 0; p<outch; p++)
    {
        for (int q = 0; q<inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p*inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i=0; i<6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j=0; j<6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i=0; i<6; i++)
                {
                    kernel_tm0[j*6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}